

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::initialVelocityProject
          (Projection *this,int c_lev,Real cur_divu_time,int have_divu,int init_vel_iter)

{
  AmrLevel *pAVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  MultiFab *pMVar6;
  MultiFab **ppMVar7;
  AmrLevel **ppAVar8;
  FArrayBox *pFVar9;
  Geometry *this_00;
  type mf;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  Projection *in_RDI;
  Real run_time;
  int IOProc;
  bool increment_gp;
  NavierStokesBase *ns;
  int Divu;
  int Divu_Type;
  MFIter mfi_1;
  Real curr_time_1;
  MultiFab *S_new_1;
  AmrLevel *amr_level_1;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  MFIter mfi;
  Real curr_time;
  MultiFab *S_new;
  AmrLevel *amr_level;
  DistributionMapping *dmap;
  BoxArray *grids;
  int nghost;
  int iter;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  sig;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> phi;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel;
  Real strt_time;
  int f_lev;
  int lev;
  MFIter *in_stack_ffffffffffffedf8;
  undefined4 uVar10;
  Amr *in_stack_ffffffffffffee00;
  undefined4 uVar11;
  uint in_stack_ffffffffffffee08;
  undefined4 in_stack_ffffffffffffee0c;
  MultiFab *in_stack_ffffffffffffee10;
  string *in_stack_ffffffffffffee18;
  int in_stack_ffffffffffffee20;
  int in_stack_ffffffffffffee24;
  FabArrayBase *in_stack_ffffffffffffee28;
  Print *in_stack_ffffffffffffee30;
  BoxArray *in_stack_ffffffffffffee38;
  Print *in_stack_ffffffffffffee40;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  *in_stack_ffffffffffffee48;
  Print *in_stack_ffffffffffffee50;
  Print *in_stack_ffffffffffffee70;
  Real in_stack_ffffffffffffee78;
  NavierStokesBase *in_stack_ffffffffffffee80;
  Print *in_stack_ffffffffffffee90;
  Print *in_stack_ffffffffffffee98;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffeea0;
  undefined8 local_10c8;
  AmrLevel *in_stack_ffffffffffffef40;
  undefined6 in_stack_ffffffffffffef48;
  byte in_stack_ffffffffffffef4e;
  undefined1 in_stack_ffffffffffffef4f;
  allocator *in_stack_ffffffffffffef50;
  AmrLevel *in_stack_ffffffffffffef58;
  undefined4 in_stack_ffffffffffffef60;
  undefined4 in_stack_ffffffffffffef64;
  undefined1 in_stack_fffffffffffff11e;
  undefined1 in_stack_fffffffffffff11f;
  int in_stack_fffffffffffff120;
  int in_stack_fffffffffffff124;
  MultiFab *in_stack_fffffffffffff128;
  double local_e10;
  int local_e04;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  *local_e00;
  Real local_df8;
  Real local_df0;
  undefined1 in_stack_fffffffffffff40e;
  undefined1 in_stack_fffffffffffff40f;
  Real in_stack_fffffffffffff410;
  Real in_stack_fffffffffffff418;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff420;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff428;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff430;
  int in_stack_fffffffffffff438;
  int in_stack_fffffffffffff43c;
  Projection *in_stack_fffffffffffff440;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff4e0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff4e8;
  MultiFab *in_stack_fffffffffffff4f8;
  MultiFab *in_stack_fffffffffffff500;
  _func_int **local_ad8;
  undefined1 auStack_ad0 [72];
  undefined1 local_a88 [16];
  pointer local_a78;
  undefined1 local_a68 [63];
  byte local_a29;
  bool local_9f8;
  bool bStack_9f7;
  bool bStack_9f6;
  undefined5 uStack_9f5;
  allocator local_9e9;
  string local_9e8 [40];
  MFIter local_9c0;
  pointer local_960;
  MultiFab *local_958;
  AmrLevel *local_950;
  MFIter local_928;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_8c8;
  AmrLevel *local_8b8;
  undefined1 local_8a9;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  pointer local_898;
  pointer piStack_890;
  pointer local_888;
  DistributionMapping *local_880;
  BoxArray *local_878;
  uint local_86c;
  int local_6e0;
  undefined8 local_6b8;
  undefined8 local_690;
  double local_670;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffa38;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffa40;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffa48;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa5c;
  Projection *in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd0;
  int local_2c;
  
  iVar5 = amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI->parent);
  local_2c = in_ESI;
  if (in_ECX < 1) {
    for (; local_2c <= iVar5; local_2c = local_2c + 1) {
      amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                 in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
      amrex::AmrLevel::get_old_data
                ((AmrLevel *)in_stack_ffffffffffffee00,
                 (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee00,
                 (value_type)in_stack_ffffffffffffedf8);
      amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                 in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
      amrex::AmrLevel::get_old_data
                ((AmrLevel *)in_stack_ffffffffffffee00,
                 (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee00,
                 (value_type)in_stack_ffffffffffffedf8);
    }
    if (verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffee30,(ostream *)in_stack_ffffffffffffee28);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee00,(char (*) [84])in_stack_ffffffffffffedf8);
      amrex::Print::~Print(in_stack_ffffffffffffee70);
    }
  }
  else {
    if (verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffee30,(ostream *)in_stack_ffffffffffffee28);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee00,(char (*) [48])in_stack_ffffffffffffedf8);
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffee00,(int *)in_stack_ffffffffffffedf8);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee00,(char (*) [2])in_stack_ffffffffffffedf8);
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffee00,(int *)in_stack_ffffffffffffedf8);
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffee70);
      if (rho_wgt_vel_proj == 0) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffee30,(ostream *)in_stack_ffffffffffffee28);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee00,(char (*) [46])in_stack_ffffffffffffedf8);
        amrex::Print::~Print(in_stack_ffffffffffffee70);
      }
      else {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffee30,(ostream *)in_stack_ffffffffffffee28);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee00,(char (*) [42])in_stack_ffffffffffffedf8);
        amrex::Print::~Print(in_stack_ffffffffffffee70);
      }
    }
    if ((verbose != 0) && (((anonymous_namespace)::benchmarking & 1) != 0)) {
      amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    }
    local_670 = amrex::ParallelDescriptor::second();
    local_690 = 0;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x82ea1b);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_ffffffffffffee10,
               CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
               (value_type *)in_stack_ffffffffffffee00,(allocator_type *)in_stack_ffffffffffffedf8);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x82ea4c);
    local_6b8 = 0;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x82ea6d);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_ffffffffffffee10,
               CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
               (value_type *)in_stack_ffffffffffffee00,(allocator_type *)in_stack_ffffffffffffedf8);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x82ea9e);
    std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>::
    allocator((allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_> *
              )0x82eab3);
    amrex::
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::vector((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8,
             (allocator_type *)0x82eacd);
    std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>::
    ~allocator((allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>
                *)0x82eadc);
    for (local_6e0 = 0; local_6e0 < in_ECX; local_6e0 = local_6e0 + 1) {
      local_2c = in_ESI;
      if (verbose != 0) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffee30,(ostream *)in_stack_ffffffffffffee28);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee00,
                   (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                    *)in_stack_ffffffffffffedf8);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee00,(char (*) [49])in_stack_ffffffffffffedf8);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee00,(int *)in_stack_ffffffffffffedf8);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee00,
                   (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                    *)in_stack_ffffffffffffedf8);
        amrex::Print::~Print(in_stack_ffffffffffffee70);
      }
      for (; local_2c <= iVar5; local_2c = local_2c + 1) {
        amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                  ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        amrex::AmrLevel::get_old_data
                  ((AmrLevel *)in_stack_ffffffffffffee00,
                   (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee00,
                   (value_type)in_stack_ffffffffffffedf8);
      }
      bVar3 = OutFlowBC::HasOutFlowBC(in_RDI->phys_bc);
      bVar4 = false;
      if ((bVar3) && (bVar4 = false, do_outflow_bcs != 0)) {
        bVar4 = in_EDX != 0;
      }
      local_86c = (uint)bVar4;
      for (local_2c = in_ESI; local_2c <= iVar5; local_2c = local_2c + 1) {
        amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                  ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        pMVar6 = amrex::AmrLevel::get_new_data
                           ((AmrLevel *)in_stack_ffffffffffffee00,
                            (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        ppMVar7 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                             in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        *ppMVar7 = pMVar6;
        amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                  ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        pMVar6 = amrex::AmrLevel::get_old_data
                           ((AmrLevel *)in_stack_ffffffffffffee00,
                            (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        ppMVar7 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                             in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        *ppMVar7 = pMVar6;
        ppAVar8 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                            ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                             in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        local_878 = amrex::AmrLevel::boxArray(*ppAVar8);
        ppAVar8 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                            ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                             in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        local_880 = amrex::AmrLevel::DistributionMap(*ppAVar8);
        amrex::
        Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        operator_new(0x180);
        local_8a9 = '\x01';
        local_898 = (pointer)0x0;
        piStack_890 = (pointer)0x0;
        local_8a8 = (pointer)0x0;
        uStack_8a0._0_1_ = false;
        uStack_8a0._1_1_ = false;
        uStack_8a0._2_1_ = false;
        uStack_8a0._3_5_ = 0;
        local_888 = (pointer)0x0;
        amrex::MFInfo::MFInfo((MFInfo *)0x82eedc);
        amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                  ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        in_stack_ffffffffffffedf8 =
             (MFIter *)amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffee00);
        amrex::MultiFab::MultiFab
                  ((MultiFab *)in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,
                   (DistributionMapping *)in_stack_ffffffffffffee30,
                   (int)((ulong)in_stack_ffffffffffffee28 >> 0x20),(int)in_stack_ffffffffffffee28,
                   (MFInfo *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
                   (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffee50);
        local_8a9 = '\0';
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_ffffffffffffee00,(pointer)in_stack_ffffffffffffedf8);
        amrex::MFInfo::~MFInfo((MFInfo *)0x82ef64);
        if (rho_wgt_vel_proj == 0) {
          amrex::
          Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x82f1d7)
          ;
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
                     (value_type)in_stack_ffffffffffffee18,
                     (int)((ulong)in_stack_ffffffffffffee10 >> 0x20));
        }
        else {
          if (0 < (int)local_86c) {
            amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
            amrex::AmrLevel::get_new_data
                      ((AmrLevel *)in_stack_ffffffffffffee00,
                       (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
            amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffeea0,(value_type)in_stack_ffffffffffffee98,
                       (int)((ulong)in_stack_ffffffffffffee90 >> 0x20),
                       (int)in_stack_ffffffffffffee90);
            local_8b8 = amrex::Amr::getLevel
                                  (in_stack_ffffffffffffee00,
                                   (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
            local_8c8._8_8_ =
                 amrex::AmrLevel::get_new_data
                           ((AmrLevel *)in_stack_ffffffffffffee00,
                            (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
            amrex::AmrLevel::get_state_data
                      ((AmrLevel *)in_stack_ffffffffffffee00,
                       (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
            local_8c8._M_allocated_capacity =
                 (size_type)
                 amrex::StateData::curTime
                           ((StateData *)
                            CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20));
            amrex::MFIter::MFIter
                      ((MFIter *)in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,
                       (uchar)((uint)in_stack_ffffffffffffee24 >> 0x18));
            while (bVar4 = amrex::MFIter::isValid(&local_928), pAVar1 = local_8b8, bVar4) {
              pFVar9 = amrex::FabArray<amrex::FArrayBox>::operator[]
                                 ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee00,
                                  in_stack_ffffffffffffedf8);
              (*pAVar1->_vptr_AmrLevel[0x1e])
                        ((int)local_8c8._M_allocated_capacity,pAVar1,pFVar9,0,3,3,1);
              amrex::MFIter::operator++(&local_928);
            }
            amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffee00);
          }
          amrex::
          Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     in_stack_ffffffffffffee00);
          amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                    ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                     in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          amrex::AmrLevel::get_new_data
                    ((AmrLevel *)in_stack_ffffffffffffee00,
                     (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
          amrex::MultiFab::Copy
                    ((MultiFab *)in_stack_ffffffffffffee30,(MultiFab *)in_stack_ffffffffffffee28,
                     in_stack_ffffffffffffee24,in_stack_ffffffffffffee20,
                     (int)((ulong)in_stack_ffffffffffffee18 >> 0x20),(int)in_stack_ffffffffffffee18)
          ;
        }
      }
      std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>::
      allocator((allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>
                 *)0x82f21f);
      amrex::
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::vector((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8,
               (allocator_type *)0x82f239);
      std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>::
      ~allocator((allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>
                  *)0x82f248);
      for (local_2c = in_ESI; local_2c <= iVar5; local_2c = local_2c + 1) {
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffeea0,(value_type)in_stack_ffffffffffffee98,
                   (int)((ulong)in_stack_ffffffffffffee90 >> 0x20),(int)in_stack_ffffffffffffee90);
        local_950 = amrex::Amr::getLevel
                              (in_stack_ffffffffffffee00,
                               (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        in_stack_ffffffffffffef64 = 0;
        local_958 = amrex::AmrLevel::get_new_data
                              ((AmrLevel *)in_stack_ffffffffffffee00,
                               (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        amrex::AmrLevel::get_state_data
                  ((AmrLevel *)in_stack_ffffffffffffee00,
                   (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        local_960 = (pointer)amrex::StateData::curTime
                                       ((StateData *)
                                        CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20
                                                ));
        amrex::MFIter::MFIter
                  ((MFIter *)in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,
                   (uchar)((uint)in_stack_ffffffffffffee24 >> 0x18));
        while (bVar4 = amrex::MFIter::isValid(&local_9c0), bVar4) {
          in_stack_ffffffffffffef58 = local_950;
          pFVar9 = amrex::FabArray<amrex::FArrayBox>::operator[]
                             ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee00,
                              in_stack_ffffffffffffedf8);
          (*in_stack_ffffffffffffef58->_vptr_AmrLevel[0x1e])
                    ((int)local_960,in_stack_ffffffffffffef58,pFVar9,0,0,0,3);
          amrex::MFIter::operator++(&local_9c0);
        }
        amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffee00);
        if (in_EDX != 0) {
          amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                    ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                     in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          in_stack_ffffffffffffef50 = &local_9e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_9e8,"divu",in_stack_ffffffffffffef50);
          in_stack_ffffffffffffef4f =
               amrex::AmrLevel::isStateVariable
                         (in_stack_ffffffffffffee18,(int *)in_stack_ffffffffffffee10,
                          (int *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
          in_stack_ffffffffffffef4e = in_stack_ffffffffffffef4f ^ 0xff;
          std::__cxx11::string::~string(local_9e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
          if ((in_stack_ffffffffffffef4e & 1) != 0) {
            amrex::Error_host((char *)in_stack_ffffffffffffee10);
          }
          ppAVar8 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                               in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          in_stack_ffffffffffffef40 = *ppAVar8;
          if (in_stack_ffffffffffffef40 == (AmrLevel *)0x0) {
            local_10c8._0_1_ = false;
            local_10c8._1_1_ = false;
            local_10c8._2_1_ = false;
            local_10c8._3_5_ = 0;
          }
          else {
            local_10c8 = __dynamic_cast(in_stack_ffffffffffffef40,&amrex::AmrLevel::typeinfo,
                                        &NavierStokesBase::typeinfo,0);
          }
          local_9f8 = local_10c8._0_1_;
          bStack_9f7 = local_10c8._1_1_;
          bStack_9f6 = local_10c8._2_1_;
          uStack_9f5 = local_10c8._3_5_;
          amrex::
          Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          NavierStokesBase::getDivCond
                    (in_stack_ffffffffffffee80,(int)((ulong)in_stack_ffffffffffffee78 >> 0x20),
                     (Real)in_stack_ffffffffffffee70);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     in_stack_ffffffffffffee00,(pointer)in_stack_ffffffffffffedf8);
        }
      }
      bVar4 = OutFlowBC::HasOutFlowBC(in_RDI->phys_bc);
      local_2c = in_ESI;
      if (((bVar4) && (do_outflow_bcs != 0)) && (in_EDX != 0)) {
        amrex::GetVecOfPtrs<amrex::MultiFab>(in_stack_ffffffffffffee48);
        uVar10 = (undefined4)((ulong)in_stack_ffffffffffffedf8 >> 0x20);
        uVar11 = (undefined4)((ulong)in_stack_ffffffffffffee00 >> 0x20);
        amrex::GetVecOfPtrs<amrex::MultiFab>(in_stack_ffffffffffffee48);
        in_stack_ffffffffffffee00 = (Amr *)CONCAT44(uVar11,iVar5);
        in_stack_ffffffffffffedf8 = (MFIter *)CONCAT44(uVar10,in_ESI);
        in_stack_ffffffffffffee08 = in_EDX;
        set_outflow_bcs(in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
                        in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                        in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                        in_stack_fffffffffffffbc0,in_stack_fffffffffffffbc8,
                        in_stack_fffffffffffffbd0);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82f6e2);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82f6ef);
      }
      for (; local_2c <= iVar5; local_2c = local_2c + 1) {
        amrex::
        Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_ffffffffffffee00);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        scaleVar((Projection *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (MultiFab *)in_stack_ffffffffffffef58,
                 (int)((ulong)in_stack_ffffffffffffef50 >> 0x20),
                 (MultiFab *)
                 CONCAT17(in_stack_ffffffffffffef4f,
                          CONCAT16(in_stack_ffffffffffffef4e,in_stack_ffffffffffffef48)),
                 (int)((ulong)in_stack_ffffffffffffef40 >> 0x20));
      }
      local_a29 = 0;
      local_2c = in_ESI;
      if (in_EDX == 0) {
        amrex::GetVecOfPtrs<amrex::MultiFab>(in_stack_ffffffffffffee48);
        local_a68._0_8_ =
             (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
        local_a68._8_8_ = (FabArrayBase *)0x0;
        local_a68._16_8_ = (pointer)0x0;
        in_stack_ffffffffffffedf8 = (MFIter *)local_a68;
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82f866);
        local_a88._0_8_ = (pointer)0x0;
        local_a88._8_8_ = (pointer)0x0;
        local_a78 = (pointer)0x0;
        in_stack_ffffffffffffee00 = (Amr *)local_a88;
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82f897);
        in_stack_ffffffffffffee08 = local_a29 & 1;
        in_stack_ffffffffffffee20 = 0;
        in_stack_ffffffffffffee18 = (string *)0x0;
        in_stack_ffffffffffffee10 = (MultiFab *)0x0;
        doMLMGNodalProjection
                  (in_stack_fffffffffffff440,in_stack_fffffffffffff43c,in_stack_fffffffffffff438,
                   in_stack_fffffffffffff430,in_stack_fffffffffffff428,in_stack_fffffffffffff420,
                   in_stack_fffffffffffff4e0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff418,
                   in_stack_fffffffffffff410,(bool)in_stack_fffffffffffff40f,
                   in_stack_fffffffffffff4f8,in_stack_fffffffffffff500,
                   (bool)in_stack_fffffffffffff40e);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82f92b);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82f938);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82f945);
      }
      else {
        for (; local_2c <= iVar5; local_2c = local_2c + 1) {
          this_00 = amrex::AmrMesh::Geom
                              ((AmrMesh *)in_stack_ffffffffffffee00,
                               (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
          bVar4 = amrex::CoordSys::IsRZ(&this_00->super_CoordSys);
          if (bVar4) {
            amrex::
            Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
            ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
            mf = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                           ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            in_stack_ffffffffffffee00);
            radMultScal(in_RDI,local_2c,mf);
          }
          amrex::
          Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x82fa39)
          ;
          amrex::MultiFab::mult
                    (in_stack_ffffffffffffee10,
                     (Real)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                     (int)((ulong)in_stack_ffffffffffffee00 >> 0x20),(int)in_stack_ffffffffffffee00,
                     (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        }
        amrex::GetVecOfPtrs<amrex::MultiFab>(in_stack_ffffffffffffee48);
        amrex::GetVecOfPtrs<amrex::MultiFab>(in_stack_ffffffffffffee48);
        local_ad8 = (_func_int **)0x0;
        auStack_ad0._0_4_ = 0;
        auStack_ad0._4_4_ = 0;
        auStack_ad0._8_8_ = (pointer)0x0;
        in_stack_ffffffffffffee00 = (Amr *)&local_ad8;
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82faeb);
        in_stack_ffffffffffffee08 = local_a29 & 1;
        in_stack_ffffffffffffedf8 = (MFIter *)(auStack_ad0 + 0x18);
        in_stack_ffffffffffffee20 = 0;
        in_stack_ffffffffffffee18 = (string *)0x0;
        in_stack_ffffffffffffee10 = (MultiFab *)0x0;
        doMLMGNodalProjection
                  (in_stack_fffffffffffff440,in_stack_fffffffffffff43c,in_stack_fffffffffffff438,
                   in_stack_fffffffffffff430,in_stack_fffffffffffff428,in_stack_fffffffffffff420,
                   in_stack_fffffffffffff4e0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff418,
                   in_stack_fffffffffffff410,(bool)in_stack_fffffffffffff40f,
                   in_stack_fffffffffffff4f8,in_stack_fffffffffffff500,
                   (bool)in_stack_fffffffffffff40e);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82fb7f);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82fb8c);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82fb99);
        local_2c = in_ESI;
      }
      for (; iVar2 = in_ESI, local_2c <= iVar5; local_2c = local_2c + 1) {
        amrex::
        Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      *)in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_ffffffffffffee00);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        rescaleVar((Projection *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                   (MultiFab *)in_stack_ffffffffffffef58,
                   (int)((ulong)in_stack_ffffffffffffef50 >> 0x20),
                   (MultiFab *)
                   CONCAT17(in_stack_ffffffffffffef4f,
                            CONCAT16(in_stack_ffffffffffffef4e,in_stack_ffffffffffffef48)),
                   (int)((ulong)in_stack_ffffffffffffef40 >> 0x20));
      }
      while (local_2c = iVar2, local_2c <= iVar5) {
        amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                  ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        amrex::AmrLevel::get_old_data
                  ((AmrLevel *)in_stack_ffffffffffffee00,
                   (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee00,
                   (value_type)in_stack_ffffffffffffedf8);
        amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                  ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        amrex::AmrLevel::get_new_data
                  ((AmrLevel *)in_stack_ffffffffffffee00,
                   (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee00,
                   (value_type)in_stack_ffffffffffffedf8);
        amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                  ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        amrex::AmrLevel::get_old_data
                  ((AmrLevel *)in_stack_ffffffffffffee00,
                   (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee00,
                   (value_type)in_stack_ffffffffffffedf8);
        amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                  ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                   in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
        amrex::AmrLevel::get_new_data
                  ((AmrLevel *)in_stack_ffffffffffffee00,
                   (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee00,
                   (value_type)in_stack_ffffffffffffedf8);
        iVar2 = local_2c + 1;
      }
      if (verbose != 0) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffee30,(ostream *)in_stack_ffffffffffffee28);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee00,(char (*) [24])in_stack_ffffffffffffedf8);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee00,
                   (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                    *)in_stack_ffffffffffffedf8);
        amrex::Print::~Print(in_stack_ffffffffffffee70);
        for (local_2c = in_ESI; local_2c <= iVar5; local_2c = local_2c + 1) {
          in_stack_ffffffffffffeea0 = (FabArray<amrex::FArrayBox> *)amrex::OutStream();
          amrex::Print::Print(in_stack_ffffffffffffee30,(ostream *)in_stack_ffffffffffffee28);
          in_stack_ffffffffffffee98 =
               amrex::Print::operator<<
                         ((Print *)in_stack_ffffffffffffee00,(char (*) [7])in_stack_ffffffffffffedf8
                         );
          in_stack_ffffffffffffee90 =
               amrex::Print::operator<<
                         ((Print *)in_stack_ffffffffffffee00,(int *)in_stack_ffffffffffffedf8);
          amrex::Print::operator<<
                    ((Print *)in_stack_ffffffffffffee00,(char (*) [3])in_stack_ffffffffffffedf8);
          in_stack_ffffffffffffee80 =
               (NavierStokesBase *)
               amrex::Print::operator<<
                         ((Print *)in_stack_ffffffffffffee00,
                          (char (*) [19])in_stack_ffffffffffffedf8);
          amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                    ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          in_stack_ffffffffffffee78 =
               amrex::MultiFab::norm0
                         (in_stack_fffffffffffff128,in_stack_fffffffffffff124,
                          in_stack_fffffffffffff120,(bool)in_stack_fffffffffffff11f,
                          (bool)in_stack_fffffffffffff11e);
          local_df0 = in_stack_ffffffffffffee78;
          in_stack_ffffffffffffee70 =
               amrex::Print::operator<<
                         ((Print *)in_stack_ffffffffffffee00,(double *)in_stack_ffffffffffffedf8);
          amrex::Print::operator<<
                    ((Print *)in_stack_ffffffffffffee00,(char (*) [2])in_stack_ffffffffffffedf8);
          amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                    ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          local_df8 = amrex::MultiFab::norm0
                                (in_stack_fffffffffffff128,in_stack_fffffffffffff124,
                                 in_stack_fffffffffffff120,(bool)in_stack_fffffffffffff11f,
                                 (bool)in_stack_fffffffffffff11e);
          amrex::Print::operator<<
                    ((Print *)in_stack_ffffffffffffee00,(double *)in_stack_ffffffffffffedf8);
          in_stack_ffffffffffffee50 =
               amrex::Print::operator<<
                         ((Print *)in_stack_ffffffffffffee00,(char (*) [2])in_stack_ffffffffffffedf8
                         );
          amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                    ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     in_stack_ffffffffffffee00,(size_type)in_stack_ffffffffffffedf8);
          in_stack_ffffffffffffee48 =
               (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)amrex::MultiFab::norm0
                            (in_stack_fffffffffffff128,in_stack_fffffffffffff124,
                             in_stack_fffffffffffff120,(bool)in_stack_fffffffffffff11f,
                             (bool)in_stack_fffffffffffff11e);
          local_e00 = in_stack_ffffffffffffee48;
          in_stack_ffffffffffffee40 =
               amrex::Print::operator<<
                         ((Print *)in_stack_ffffffffffffee00,(double *)in_stack_ffffffffffffedf8);
          amrex::Print::operator<<
                    ((Print *)in_stack_ffffffffffffee00,
                     (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                      *)in_stack_ffffffffffffedf8);
          amrex::Print::~Print(in_stack_ffffffffffffee70);
        }
      }
      amrex::
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::~Vector((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 *)0x8300aa);
    }
    if (verbose != 0) {
      local_e04 = amrex::ParallelDescriptor::IOProcessorNumber();
      local_e10 = amrex::ParallelDescriptor::second();
      local_e10 = local_e10 - local_670;
      amrex::ParallelDescriptor::ReduceRealMax<double>(&local_e10,local_e04);
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffee30,(ostream *)in_stack_ffffffffffffee28);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee00,(char (*) [45])in_stack_ffffffffffffedf8);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee00,(double *)in_stack_ffffffffffffedf8);
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffee70);
    }
    amrex::
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::~Vector((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               *)0x8301cb);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x8301d8);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x8301e5);
  }
  return;
}

Assistant:

void
Projection::initialVelocityProject (int  c_lev,
                                    Real cur_divu_time,
                                    int  have_divu,
                                    int init_vel_iter )
{
    int lev;
    int f_lev = parent->finestLevel();

    if ( init_vel_iter <= 0 ){
      // Make sure P_old is initialized
      for (lev = c_lev; lev <= f_lev; lev++)
      {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.);
            LevelData[lev]->get_old_data(Gradp_Type).setVal(0.);
      }
      
      if ( verbose ) Print()<<"Returning from initalVelocityProject() without projecting because init_vel_iter<=0\n";
      return;
    }

    if (verbose)
    {
        amrex::Print() << "Projection::initialVelocityProject(): levels = " << c_lev
                       << "-" << f_lev << '\n';
        if (rho_wgt_vel_proj)
            amrex::Print() << "RHO WEIGHTED INITIAL VELOCITY PROJECTION\n";
        else
            amrex::Print() << "CONSTANT DENSITY INITIAL VELOCITY PROJECTION\n";
    }

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real strt_time = ParallelDescriptor::second();

    Vector<MultiFab*> vel(maxlev, nullptr);
    Vector<MultiFab*> phi(maxlev, nullptr);
    Vector<std::unique_ptr<MultiFab> > sig(maxlev);

    for (int iter = 0; iter < init_vel_iter; ++iter)
    {
        if (verbose)
        {
            amrex::Print() << std::endl
                           << "Projection::initialVelocityProject(): iteration "
                           << iter
                           << std::endl;
        }

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.0);
        }

	// MLNodeLaplacian does not take any ghost cells from rhcc or sig.
	// copies only valid cells and fills ghosts internally.
	// However, vel and phi are assumed to have 1 ghost cell in MLMG.
	// set outflow bcs fills vel and phi using 1 ghost cell from sig (holding rho)
	// and rhcc (holding divu)
	const int nghost =
	  (OutFlowBC::HasOutFlowBC(phys_bc) && do_outflow_bcs && have_divu) ? 1 : 0;

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            vel[lev] = &(LevelData[lev]->get_new_data(State_Type));
            phi[lev] = &(LevelData[lev]->get_old_data(Press_Type));

            const BoxArray& grids  = LevelData[lev]->boxArray();
            const DistributionMapping& dmap = LevelData[lev]->DistributionMap();
            sig[lev].reset(new MultiFab(grids,dmap,1,nghost,MFInfo(),LevelData[lev]->Factory()));

            if (rho_wgt_vel_proj)
            {
	      if ( nghost > 0 ){
                LevelData[lev]->get_new_data(State_Type).setBndry(BogusValue,Density,1);

                AmrLevel& amr_level = parent->getLevel(lev);

                MultiFab& S_new = amr_level.get_new_data(State_Type);

                Real curr_time = amr_level.get_state_data(State_Type).curTime();

                for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
                {
                    amr_level.setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,
                                                    Density,Density,1);
                }
	      }

	      MultiFab::Copy(*sig[lev],
			     LevelData[lev]->get_new_data(State_Type),
			     Density, 0, 1, nghost);
            }
            else
            {
                sig[lev]->setVal(1.,nghost);
            }
        }

        Vector<std::unique_ptr<MultiFab> > rhcc(maxlev);

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            vel[lev]->setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
            //
            // Set the physical boundary values.
            //
            AmrLevel& amr_level = parent->getLevel(lev);

            MultiFab& S_new = amr_level.get_new_data(State_Type);

            Real curr_time = amr_level.get_state_data(State_Type).curTime();

            for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
            {
                amr_level.setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,Xvel,Xvel,AMREX_SPACEDIM);
            }

            if (have_divu)
            {
                int Divu_Type, Divu;
                if (!LevelData[lev]->isStateVariable("divu", Divu_Type, Divu))
		  amrex::Error("Projection::initialVelocityProject(): Divu not found");

		NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[lev]);
		AMREX_ASSERT(!(ns == 0));

		rhcc[lev].reset(ns->getDivCond(nghost,cur_divu_time));
            }
        }

        if (OutFlowBC::HasOutFlowBC(phys_bc) && do_outflow_bcs && have_divu)
        {
            set_outflow_bcs(INITIAL_VEL,phi,vel,
                            amrex::GetVecOfPtrs(rhcc),
                            amrex::GetVecOfPtrs(sig),
                            c_lev,f_lev,have_divu);
        }

        //
        // Scale the projection variables.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            scaleVar(sig[lev].get(),nghost,vel[lev],lev);
        }

        //
        // Project
        //
        //

        bool increment_gp = false;
        if (!have_divu)
        {
            doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi,
                                  amrex::GetVecOfPtrs(sig),
                                  {},
                                  {},
                                  proj_tol, proj_abs_tol, increment_gp, 0, 0);
        }
        else
        {
            for (lev = c_lev; lev <= f_lev; lev++)
            {
                if (parent->Geom(0).IsRZ()) radMultScal(lev,*rhcc[lev]);
                rhcc[lev]->mult(-1.0,0,1,nghost);
            }

            doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi,
                                  amrex::GetVecOfPtrs(sig),
                                  amrex::GetVecOfPtrs(rhcc),
                                  {},
                                  proj_tol, proj_abs_tol, increment_gp, 0, 0);
        }

        //
        // Unscale initial projection variables.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
            rescaleVar(sig[lev].get(),nghost,vel[lev],lev);

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.);
            LevelData[lev]->get_new_data(Press_Type).setVal(0.);

            LevelData[lev]->get_old_data(Gradp_Type).setVal(0.);
            LevelData[lev]->get_new_data(Gradp_Type).setVal(0.);
        }

        if (verbose)
        {
            amrex::Print() << "After nodal projection:" << std::endl;
            for (lev = c_lev; lev <= f_lev; ++lev)
            {
                amrex::Print() << "  lev " << lev << ": "
#if (AMREX_SPACEDIM==3)
                               << "max(abs(u,v,w)) = "
#else
                               << "max(abs(u,v)) = "
#endif
                               << vel[lev]->norm0(0,0,false,true) << " "
                               << vel[lev]->norm0(1,0,false,true) << " "
#if (AMREX_SPACEDIM==3)
                               << vel[lev]->norm0(2,0,false,true)
#endif
                               << std::endl;
            }
        }
    }

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

	amrex::Print() << "Projection::initialVelocityProject(): time: " << run_time << '\n';
    }
}